

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::Event::armBreadthFirst(Event *this)

{
  Event **ppEVar1;
  EventLoop *pEVar2;
  EventLoop *pEVar3;
  Event **ppEVar4;
  long in_FS_OFFSET;
  bool _kjCondition;
  Fault f;
  
  pEVar2 = this->loop;
  pEVar3 = *(EventLoop **)(in_FS_OFFSET + -0x28);
  _kjCondition = pEVar3 == (EventLoop *)0x0 || pEVar3 == pEVar2;
  if (pEVar3 != (EventLoop *)0x0 && pEVar3 != pEVar2) {
    Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[111]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x8a6,FAILED,"threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr",
               "_kjCondition,\"Event armed from different thread than it was created in.  You must use \" \"Executor to queue events cross-thread.\""
               ,&_kjCondition,
               (char (*) [111])
               "Event armed from different thread than it was created in.  You must use Executor to queue events cross-thread."
              );
    Debug::Fault::fatal(&f);
  }
  if (this->live == 0x1e366381) {
    if (this->prev != (Event **)0x0) {
      return;
    }
    ppEVar4 = pEVar2->breadthFirstInsertPoint;
    ppEVar1 = &this->next;
    this->next = *ppEVar4;
    this->prev = ppEVar4;
    *ppEVar4 = this;
    if (this->next != (Event *)0x0) {
      this->next->prev = ppEVar1;
    }
    pEVar2 = this->loop;
    pEVar2->breadthFirstInsertPoint = ppEVar1;
    if (pEVar2->tail == this->prev) {
      pEVar2->tail = ppEVar1;
    }
    EventLoop::setRunnable(pEVar2,true);
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42],kj::SourceLocation&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x8a9,FAILED,(char *)0x0,"\"tried to arm Event after it was destroyed\", location",
             (char (*) [42])"tried to arm Event after it was destroyed",&this->location);
  Debug::Fault::fatal(&f);
}

Assistant:

void Event::armBreadthFirst() {
  KJ_REQUIRE(threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr,
             "Event armed from different thread than it was created in.  You must use "
             "Executor to queue events cross-thread.");
  if (live != MAGIC_LIVE_VALUE) {
    ([this]() noexcept {
      KJ_FAIL_ASSERT("tried to arm Event after it was destroyed", location);
    })();
  }

  if (prev == nullptr) {
    next = *loop.breadthFirstInsertPoint;
    prev = loop.breadthFirstInsertPoint;
    *prev = this;
    if (next != nullptr) {
      next->prev = &next;
    }

    loop.breadthFirstInsertPoint = &next;

    if (loop.tail == prev) {
      loop.tail = &next;
    }

    loop.setRunnable(true);
  }
}